

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_sendrecv(Curl_easy *data,curltime *nowp)

{
  int *piVar1;
  undefined1 *puVar2;
  byte bVar3;
  long lVar4;
  curl_off_t cVar5;
  connectdata *pcVar6;
  long lVar7;
  curl_trc_feat *pcVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  char *buf;
  _Bool _Var15;
  char cVar16;
  _Bool _Var17;
  CURLcode CVar18;
  int iVar19;
  CURLcode CVar20;
  timediff_t tVar21;
  size_t sVar22;
  uint uVar23;
  size_t sVar24;
  bool bVar25;
  curltime newer;
  curltime now;
  curltime older;
  ssize_t nread;
  char *xfer_buf;
  _Bool local_69 [9];
  curltime *local_60;
  size_t local_58;
  connectdata *local_50;
  long local_48;
  char *local_40;
  size_t local_38;
  
  bVar3 = (data->state).select_bits;
  if (bVar3 == 0) {
LAB_00160ab8:
    uVar23 = 0;
    if (((data->req).keepon & 1) != 0) {
      pcVar6 = data->conn;
      CVar18 = Curl_multi_xfer_buf_borrow(data,&local_40,&local_38);
      uVar23 = 0;
      if (CVar18 == CURLE_OK) {
        iVar19 = 10;
        local_69[1] = false;
        local_69[2] = false;
        local_69[3] = false;
        local_69[4] = false;
        local_69[5] = false;
        local_69[6] = false;
        local_69[7] = false;
        local_69[8] = false;
        local_48 = 0;
        _Var15 = false;
        local_60 = nowp;
        local_50 = pcVar6;
        do {
          if (_Var15 == false) {
            _Var15 = Curl_conn_is_multiplex(local_50,0);
          }
          buf = local_40;
          if (local_38 == 0) {
            sVar24 = 0;
LAB_00160c44:
            if (((_Var15 == false) && (((data->req).field_0xd1 & 1) == 0)) &&
               (lVar4 = (data->req).size, lVar4 != -1)) {
              lVar7 = (data->req).bytecount;
              sVar22 = lVar4 - lVar7;
              if (sVar22 == 0 || lVar4 < lVar7) {
LAB_00160ca3:
                sVar24 = 0;
              }
              else if ((long)sVar22 < (long)sVar24) {
                sVar24 = sVar22;
              }
            }
            else if (((data != (Curl_easy *)0x0) &&
                     (pcVar6 = data->conn, pcVar6 != (connectdata *)0x0)) &&
                    ((pcVar6->sockfd != -1 &&
                     (_Var17 = Curl_shutdown_started(data,(uint)(pcVar6->sockfd == pcVar6->sock[1]))
                     , _Var17)))) goto LAB_00160ca3;
            if (sVar24 == 0) {
              local_58 = 0;
              CVar18 = CURLE_OK;
            }
            else {
              CVar18 = Curl_xfer_recv(data,buf,sVar24,(ssize_t *)&local_58);
            }
            sVar24 = 0xffffffffffffffff;
            if (((CVar18 == CURLE_OK) && (sVar24 = local_58, local_58 == 0)) &&
               (((data->req).field_0xd3 & 0x10) != 0)) {
              CVar18 = CURLE_FAILED_INIT;
              if (((data != (Curl_easy *)0x0) && (pcVar6 = data->conn, pcVar6 != (connectdata *)0x0)
                  ) && (pcVar6->sockfd != -1)) {
                CVar18 = Curl_conn_shutdown(data,(uint)(pcVar6->sockfd == pcVar6->sock[1]),local_69)
                ;
              }
              CVar20 = CVar18;
              if ((CVar18 != CURLE_OK) ||
                 (sVar24 = local_58, CVar20 = CURLE_AGAIN, local_69[0] != true)) {
                sVar24 = 0xffffffffffffffff;
                CVar18 = CVar20;
              }
            }
            if ((long)sVar24 < 0) {
              cVar16 = '\x02';
              if (CVar18 == CURLE_AGAIN) {
                cVar16 = '\x03';
                CVar18 = CURLE_OK;
                if ((*(uint *)&(data->req).field_0xd1 & 0x22008) == 0x20008) {
                  sVar24 = 0;
                  goto LAB_00160cfa;
                }
              }
            }
            else {
LAB_00160cfa:
              if (sVar24 == 0) {
                CVar18 = Curl_req_stop_send_recv(data);
                cVar16 = '\x02';
                local_69[1] = true;
                local_69[2] = false;
                local_69[3] = false;
                local_69[4] = false;
                local_69[5] = false;
                local_69[6] = false;
                local_69[7] = false;
                local_69[8] = false;
                if ((CVar18 != CURLE_OK) || (cVar16 = '\x03', ((data->req).field_0xd1 & 0x10) != 0))
                goto LAB_00160dd8;
              }
              local_48 = local_48 + sVar24;
              CVar18 = Curl_xfer_write_resp(data,buf,sVar24,sVar24 == 0);
              cVar16 = '\x02';
              local_69[1] = true;
              local_69[2] = false;
              local_69[3] = false;
              local_69[4] = false;
              local_69[5] = false;
              local_69[6] = false;
              local_69[7] = false;
              local_69[8] = false;
              if ((CVar18 == CURLE_OK) &&
                 (uVar23 = *(uint *)&(data->req).field_0xd1, (uVar23 & 2) == 0)) {
                if ((sVar24 == 0) || ((uVar23 & 8) != 0 && _Var15 == false)) {
                  piVar1 = &(data->req).keepon;
                  *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
                }
                cVar16 = (((data->req).keepon & 0x11U) != 1) * '\x03';
              }
            }
          }
          else {
            sVar22 = (data->set).max_recv_speed;
            sVar24 = local_38;
            if ((long)sVar22 < 1) goto LAB_00160c44;
            cVar16 = '\x03';
            if (local_48 == 0) {
              if ((long)sVar22 < (long)local_38) {
                sVar24 = sVar22;
              }
              goto LAB_00160c44;
            }
          }
LAB_00160dd8:
          if (cVar16 != '\0') {
            if (cVar16 == '\x01') {
              uVar23 = (uint)local_69._1_8_;
              nowp = local_60;
              goto LAB_00160fab;
            }
            if (cVar16 == '\x02') goto LAB_00160f94;
            goto LAB_00160e85;
          }
          bVar25 = iVar19 != 0;
          iVar19 = iVar19 + -1;
        } while (bVar25);
        iVar19 = -1;
LAB_00160e85:
        if (iVar19 < 1) {
LAB_00160f20:
          (data->state).select_bits = (((data->req).keepon & 0x2aU) == 2) * '\x02' + '\x01';
        }
        else {
          uVar23 = data->conn->handler->protocol;
          iVar19 = 1;
          if ((uVar23 & 0xc) == 0) {
            if ((uVar23 & 0x30) != 0) goto LAB_00160f20;
            iVar19 = 0;
          }
          _Var17 = Curl_conn_data_pending(data,iVar19);
          if (_Var17) goto LAB_00160f20;
        }
        if ((((data->req).keepon & 3U) == 2) &&
           ((((ulong)local_50->bits & 0x20) != 0 || (_Var15 != false)))) {
          if ((data != (Curl_easy *)0x0) &&
             ((((data->set).field_0x89f & 0x40) != 0 &&
              ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
               (0 < pcVar8->log_level)))))) {
            Curl_infof(data,"we are done reading and this is set to close, stop send");
          }
          Curl_req_abort_sending(data);
        }
LAB_00160f94:
        uVar23 = (uint)local_69._1_8_;
        nowp = local_60;
      }
      Curl_multi_xfer_buf_release(data,local_40);
LAB_00160fab:
      if (CVar18 != CURLE_OK) {
        return CVar18;
      }
      if (((data->req).field_0xd1 & 2) != 0) goto LAB_00160fbd;
    }
    _Var15 = Curl_req_want_send(data);
    if ((_Var15) || (((data->req).keepon & 0x40) != 0)) {
      _Var15 = Curl_req_done_sending(data);
      CVar18 = CURLE_OK;
      if (!_Var15) {
        uVar23 = uVar23 | 2;
        CVar18 = Curl_req_send_more(data);
      }
      if (CVar18 != CURLE_OK) {
        return CVar18;
      }
    }
    if ((uVar23 != 0) || (CVar18 = Curl_conn_ev_data_idle(data), CVar18 == CURLE_OK)) {
      iVar19 = Curl_pgrsUpdate(data);
      CVar18 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar19 == 0) {
        uVar9 = nowp->tv_sec;
        uVar10 = nowp->tv_usec;
        now.tv_usec = uVar10;
        now.tv_sec = uVar9;
        now._12_4_ = 0;
        CVar18 = Curl_speedcheck(data,now);
      }
      if (CVar18 == CURLE_OK) {
        if ((data->req).keepon == 0) {
          if ((((((data->req).field_0xd3 & 2) == 0) && (lVar4 = (data->req).size, lVar4 != -1)) &&
              (lVar4 != (data->req).bytecount)) && ((data->req).newurl == (char *)0x0)) {
            Curl_failf(data,"transfer closed with %ld bytes remaining to read");
            return CURLE_PARTIAL_FILE;
          }
          iVar19 = Curl_pgrsUpdate(data);
          if (iVar19 != 0) {
            return CURLE_ABORTED_BY_CALLBACK;
          }
        }
        else {
          tVar21 = Curl_timeleft(data,nowp,false);
          if (tVar21 < 0) {
            lVar4 = (data->req).size;
            uVar11 = nowp->tv_sec;
            uVar12 = nowp->tv_usec;
            newer.tv_usec = uVar12;
            newer.tv_sec = uVar11;
            uVar13 = (data->progress).t_startsingle.tv_sec;
            uVar14 = (data->progress).t_startsingle.tv_usec;
            older.tv_usec = uVar14;
            older.tv_sec = uVar13;
            newer._12_4_ = 0;
            older._12_4_ = 0;
            tVar21 = Curl_timediff(newer,older);
            cVar5 = (data->req).bytecount;
            if (lVar4 == -1) {
              Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                         tVar21,cVar5);
            }
            else {
              Curl_failf(data,
                         "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                         ,tVar21,cVar5,(data->req).size);
            }
            return CURLE_OPERATION_TIMEDOUT;
          }
        }
        CVar18 = CURLE_OK;
        if (((data->req).keepon & 0x3f) == 0) {
          puVar2 = &(data->req).field_0xd1;
          *puVar2 = *puVar2 | 2;
        }
      }
    }
  }
  else {
    if (((((bVar3 & 1) != 0) && (((data->req).keepon & 0x10) == 0)) ||
        (((bVar3 & 2) != 0 && (((data->req).keepon & 0x20) == 0)))) ||
       (((data->req).keepon & 0x30) == 0)) {
      (data->state).select_bits = '\0';
      goto LAB_00160ab8;
    }
LAB_00160fbd:
    CVar18 = CURLE_OK;
  }
  return CVar18;
}

Assistant:

CURLcode Curl_sendrecv(struct Curl_easy *data, struct curltime *nowp)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;
  int didwhat = 0;

  DEBUGASSERT(nowp);
  if(data->state.select_bits) {
    if(select_bits_paused(data, data->state.select_bits)) {
      /* leave the bits unchanged, so they'll tell us what to do when
       * this transfer gets unpaused. */
      result = CURLE_OK;
      goto out;
    }
    data->state.select_bits = 0;
  }

  /* We go ahead and do a read if we have a readable socket or if the stream
     was rewound (in which case we have data in a buffer) */
  if(k->keepon & KEEP_RECV) {
    result = sendrecv_dl(data, k, &didwhat);
    if(result || data->req.done)
      goto out;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if(Curl_req_want_send(data) || (data->req.keepon & KEEP_SEND_TIMED)) {
    result = sendrecv_ul(data, &didwhat);
    if(result)
      goto out;
  }

  if(!didwhat) {
    /* Transfer wanted to send/recv, but nothing was possible. */
    result = Curl_conn_ev_data_idle(data);
    if(result)
      goto out;
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, *nowp);
  if(result)
    goto out;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, nowp, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount);
      }
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */
    if(!(data->req.no_body) && (k->size != -1) &&
       (k->bytecount != k->size) && !k->newurl) {
      failf(data, "transfer closed with %" FMT_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      result = CURLE_PARTIAL_FILE;
      goto out;
    }
    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

  /* If there is nothing more to send/recv, the request is done */
  if(0 == (k->keepon&(KEEP_RECVBITS|KEEP_SENDBITS)))
    data->req.done = TRUE;

out:
  if(result)
    DEBUGF(infof(data, "Curl_sendrecv() -> %d", result));
  return result;
}